

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O0

wchar_t * cmsysEncoding_DupToWide(char *str)

{
  size_t sVar1;
  size_t length;
  wchar_t *ret;
  char *str_local;
  
  length = 0;
  sVar1 = cmsysEncoding_mbstowcs((wchar_t *)0x0,str,0);
  sVar1 = sVar1 + 1;
  if (sVar1 != 0) {
    length = (size_t)malloc(sVar1 * 4);
    *(wchar_t *)length = L'\0';
    cmsysEncoding_mbstowcs((wchar_t *)length,str,sVar1);
  }
  return (wchar_t *)length;
}

Assistant:

wchar_t* kwsysEncoding_DupToWide(const char* str)
{
  wchar_t* ret = NULL;
  size_t length = kwsysEncoding_mbstowcs(NULL, str, 0) + 1;
  if(length > 0)
    {
    ret = (wchar_t*)malloc((length)*sizeof(wchar_t));
    ret[0] = 0;
    kwsysEncoding_mbstowcs(ret, str, length);
    }
  return ret;
}